

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O1

VP8StatusCode FinishDecoding(WebPIDecoder *idec)

{
  WebPDecoderOptions *pWVar1;
  int iVar2;
  VP8StatusCode VVar3;
  VP8StatusCode VVar4;
  long lVar5;
  VP8StatusCode unaff_EBP;
  WebPDecBuffer *pWVar6;
  WebPDecBuffer *buffer;
  byte bVar7;
  
  bVar7 = 0;
  buffer = (idec->params_).output;
  pWVar1 = (idec->params_).options;
  idec->state_ = STATE_DONE;
  if (((pWVar1 == (WebPDecoderOptions *)0x0) || (pWVar1->flip == 0)) ||
     (unaff_EBP = WebPFlipBuffer(buffer), unaff_EBP == VP8_STATUS_OK)) {
    if (idec->final_output_ != (WebPDecBuffer *)0x0) {
      VVar3 = WebPCopyDecBufferPixels(buffer,idec->final_output_);
      WebPFreeDecBuffer(&idec->output_);
      VVar4 = VVar3;
      if (VVar3 == VP8_STATUS_OK) {
        pWVar6 = idec->final_output_;
        for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
          iVar2 = pWVar6->width;
          buffer->colorspace = pWVar6->colorspace;
          buffer->width = iVar2;
          pWVar6 = (WebPDecBuffer *)((long)pWVar6 + (ulong)bVar7 * -0x10 + 8);
          buffer = (WebPDecBuffer *)((long)buffer + (ulong)bVar7 * -0x10 + 8);
        }
        idec->final_output_ = (WebPDecBuffer *)0x0;
        VVar4 = unaff_EBP;
      }
      if (VVar3 != VP8_STATUS_OK) {
        return VVar4;
      }
    }
    unaff_EBP = VP8_STATUS_OK;
  }
  return unaff_EBP;
}

Assistant:

WEBP_NODISCARD static VP8StatusCode FinishDecoding(WebPIDecoder* const idec) {
  const WebPDecoderOptions* const options = idec->params_.options;
  WebPDecBuffer* const output = idec->params_.output;

  idec->state_ = STATE_DONE;
  if (options != NULL && options->flip) {
    const VP8StatusCode status = WebPFlipBuffer(output);
    if (status != VP8_STATUS_OK) return status;
  }
  if (idec->final_output_ != NULL) {
    const VP8StatusCode status = WebPCopyDecBufferPixels(
        output, idec->final_output_);  // do the slow-copy
    WebPFreeDecBuffer(&idec->output_);
    if (status != VP8_STATUS_OK) return status;
    *output = *idec->final_output_;
    idec->final_output_ = NULL;
  }
  return VP8_STATUS_OK;
}